

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.cpp
# Opt level: O1

unique_ptr<Event,_std::default_delete<Event>_> * __thiscall Events::onPeerDisconnect(Events *this)

{
  unique_ptr<Event,_std::default_delete<Event>_> *puVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"onPeerDisconnect","");
  puVar1 = EventRegister::on(&this->super_EventRegister,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return puVar1;
}

Assistant:

const std::unique_ptr<Event> &Events::onPeerDisconnect()
{
    return this->on("onPeerDisconnect");
}